

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O0

int os_time(lua_State *L)

{
  int iVar1;
  undefined1 local_58 [8];
  tm ts;
  time_t t;
  lua_State *L_local;
  
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) {
    ts.__tm_zone = (char *)time((time_t *)0x0);
  }
  else {
    luaL_checktype(L,1,5);
    lua_settop(L,1);
    local_58._0_4_ = getfield(L,"sec",0,0);
    local_58._4_4_ = getfield(L,"min",0,0);
    ts.tm_sec = getfield(L,"hour",0xc,0);
    ts.tm_min = getfield(L,"day",-1,0);
    ts.tm_hour = getfield(L,"month",-1,1);
    ts.tm_mday = getfield(L,"year",-1,0x76c);
    ts.tm_wday = getboolfield(L,"isdst");
    ts.__tm_zone = (char *)mktime((tm *)local_58);
    setallfields(L,(tm *)local_58);
  }
  if (ts.__tm_zone == (char *)0xffffffffffffffff) {
    L_local._4_4_ = luaL_error(L,"time result cannot be represented in this installation");
  }
  else {
    lua_pushinteger(L,(lua_Integer)ts.__tm_zone);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int os_time (lua_State *L) {
  time_t t;
  if (lua_isnoneornil(L, 1))  /* called without args? */
    t = time(NULL);  /* get current time */
  else {
    struct tm ts;
    luaL_checktype(L, 1, LUA_TTABLE);
    lua_settop(L, 1);  /* make sure table is at the top */
    ts.tm_sec = getfield(L, "sec", 0, 0);
    ts.tm_min = getfield(L, "min", 0, 0);
    ts.tm_hour = getfield(L, "hour", 12, 0);
    ts.tm_mday = getfield(L, "day", -1, 0);
    ts.tm_mon = getfield(L, "month", -1, 1);
    ts.tm_year = getfield(L, "year", -1, 1900);
    ts.tm_isdst = getboolfield(L, "isdst");
    t = mktime(&ts);
    setallfields(L, &ts);  /* update fields with normalized values */
  }
  if (t != (time_t)(l_timet)t || t == (time_t)(-1))
    return luaL_error(L,
                  "time result cannot be represented in this installation");
  l_pushtime(L, t);
  return 1;
}